

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

InstanceSymbol *
slang::ast::InstanceSymbol::createVirtual
          (ASTContext *context,SourceLocation loc,Definition *definition,
          ParameterValueAssignmentSyntax *paramAssignments)

{
  span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL> parameterDecls;
  Scope *pSVar1;
  Compilation *args;
  InstanceSymbol *pIVar2;
  ParameterBuilder paramBuilder;
  bool local_199;
  SourceLocation local_198;
  ParameterBuilder local_190;
  
  local_198 = loc;
  pSVar1 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  parameterDecls.data_ =
       (definition->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_;
  parameterDecls.size_ =
       (definition->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len;
  ParameterBuilder::ParameterBuilder(&local_190,pSVar1,definition->name,parameterDecls);
  local_190.instanceContext = context;
  if (paramAssignments != (ParameterValueAssignmentSyntax *)0x0) {
    ParameterBuilder::setAssignments(&local_190,paramAssignments);
  }
  args = ASTContext::getCompilation(context);
  local_199 = false;
  pIVar2 = BumpAllocator::
           emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation&,slang::ast::Definition_const&,slang::ast::ParameterBuilder&,bool>
                     (&args->super_BumpAllocator,args,&definition->name,&local_198,definition,
                      &local_190,&local_199);
  pSVar1 = not_null<const_slang::ast::Scope_*>::get(&context->scope);
  (pIVar2->super_InstanceSymbolBase).super_Symbol.parentScope = pSVar1;
  ska::detailv3::
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  ::~sherwood_v3_table
            (&local_190.assignments.
              super_flat_hash_map<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
              .
              super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
            );
  return pIVar2;
}

Assistant:

InstanceSymbol& InstanceSymbol::createVirtual(
    const ASTContext& context, SourceLocation loc, const Definition& definition,
    const ParameterValueAssignmentSyntax* paramAssignments) {

    ParameterBuilder paramBuilder(*context.scope, definition.name, definition.parameters);
    paramBuilder.setInstanceContext(context);
    if (paramAssignments)
        paramBuilder.setAssignments(*paramAssignments);

    auto& comp = context.getCompilation();
    auto& result = *comp.emplace<InstanceSymbol>(comp, definition.name, loc, definition,
                                                 paramBuilder,
                                                 /* isUninstantiated */ false);

    // Set the parent pointer so that traversing upwards still works to find
    // the instantiation scope. This "virtual" instance never actually gets
    // added to the scope the proper way as a member.
    result.setParent(*context.scope);
    return result;
}